

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O1

void nn_surveyor_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm_fn *pp_Var1;
  
  pp_Var1 = &self[-5].shutdown_fn;
  if (self == (nn_fsm *)0x0) {
    pp_Var1 = (nn_fsm_fn *)0x0;
  }
  if (type == -3 && src == -2) goto LAB_00155723;
  while (*(int *)(pp_Var1 + 0x41) != 6) {
    nn_surveyor_shutdown_cold_1();
LAB_00155723:
    nn_timer_stop((nn_timer *)(pp_Var1 + 0x42));
    *(undefined4 *)(pp_Var1 + 0x41) = 6;
  }
  nn_surveyor_shutdown_cold_2();
  return;
}

Assistant:

static void nn_surveyor_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, fsm);

    if (nn_slow (src== NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&surveyor->timer);
        surveyor->state = NN_SURVEYOR_STATE_STOPPING;
    }
    if (nn_slow (surveyor->state == NN_SURVEYOR_STATE_STOPPING)) {
        if (!nn_timer_isidle (&surveyor->timer))
            return;
        surveyor->state = NN_SURVEYOR_STATE_IDLE;
        nn_fsm_stopped_noevent (&surveyor->fsm);
        nn_sockbase_stopped (&surveyor->xsurveyor.sockbase);
        return;
    }

    nn_fsm_bad_state(surveyor->state, src, type);
}